

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::VertexShaderSecondaryTestInstance::executeTest
          (TestStatus *__return_storage_ptr__,VertexShaderSecondaryTestInstance *this)

{
  deInt32 *pdVar1;
  Handle<(vk::HandleType)11> obj;
  deUint32 _queueFamilyIndex;
  VkResult result;
  value_type *__val;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Move<vk::Handle<(vk::HandleType)11>_> local_168;
  SharedPtr<vkt::Draw::Buffer> vertexBufferSp;
  long local_138;
  Image *pIStack_130;
  SharedPtrStateBase *local_128;
  Image *pIStack_120;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> renderPassClearValues;
  Deleter<vk::Handle<(vk::HandleType)11>_> DStack_f0;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandBufferBeginInfo info;
  pointer local_68;
  pointer local_58;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  
  vk = Context::getDeviceInterface
                 ((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                  super_StatisticQueryTestInstance.super_TestInstance.m_context);
  device = Context::getDevice((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  queue = Context::getUniversalQueue
                    ((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                     super_StatisticQueryTestInstance.super_TestInstance.m_context);
  _queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                  super_StatisticQueryTestInstance.super_TestInstance.m_context);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo
            ((CmdPoolCreateInfo *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,_queueFamilyIndex
             ,2);
  ::vk::createCommandPool
            (&cmdPool,vk,device,&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,
             (VkAllocationCallbacks *)0x0);
  info.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
  info.pNext = (void *)0x0;
  info.flags = 0;
  info._20_4_ = 1;
  info.pInheritanceInfo =
       (VkCommandBufferInheritanceInfo *)
       CONCAT44(((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                m_parametersGraphic)->queryStatisticFlags,1);
  ::vk::createQueryPool
            (&local_168,vk,device,(VkQueryPoolCreateInfo *)&info,(VkAllocationCallbacks *)0x0);
  obj.m_internal = local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal
  ;
  DStack_f0.m_deviceIface =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface;
  DStack_f0.m_device =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device;
  DStack_f0.m_allocator =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator;
  vertexBufferOffset = 0;
  GraphicBasicTestInstance::creatAndFillVertexBuffer((GraphicBasicTestInstance *)&vertexBufferSp);
  vertexBuffer.m_internal =
       ((vertexBufferSp.m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
       object.m_internal;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&info,vk,device,
             (VkCommandPool)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device =
       (VkDevice)info._16_8_;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)info.pInheritanceInfo;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal = info._0_8_;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)info.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&info,vk,device,
             (VkCommandPool)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_SECONDARY);
  local_128 = (SharedPtrStateBase *)info._16_8_;
  pIStack_120 = (Image *)info.pInheritanceInfo;
  local_138 = info._0_8_;
  pIStack_130 = (Image *)info.pNext;
  beginSecondaryCommandBuffer
            (vk,(VkCommandBuffer)info._0_8_,
             ((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
             m_parametersGraphic)->queryStatisticFlags,
             (VkRenderPass)
             (this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.m_renderPass.
             super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,
             (VkFramebuffer)
             (this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.m_framebuffer.
             super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal,2);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_138,0,
             (this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x6e])(vk,local_138,obj.m_internal,0,0);
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_138,0,1,&vertexBuffer,&vertexBufferOffset);
  (*(this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
    super_StatisticQueryTestInstance.super_TestInstance._vptr_TestInstance[7])(this,local_138);
  (*vk->_vptr_DeviceInterface[0x6f])(vk,local_138,obj.m_internal,0);
  (*vk->_vptr_DeviceInterface[0x4a])(vk,local_138);
  info.flags = 1;
  info._20_4_ = 0;
  info.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  info._4_4_ = 0;
  info.pNext = (void *)0x0;
  result = (*vk->_vptr_DeviceInterface[0x49])
                     (vk,local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.
                         m_internal);
  ::vk::checkResult(result,"vk.beginCommandBuffer(commandBuffer, &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x75);
  renderPassClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  renderPassClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  renderPassClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  renderPassClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  renderPassClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       renderPassClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  *(float *)renderPassClearValues.
            super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
            super__Vector_impl_data._M_start = 0.0;
  *(deUint32 *)
   ((long)renderPassClearValues.
          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)renderPassClearValues.
          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 8) = 0;
  *(float *)(renderPassClearValues.
             super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
             super__Vector_impl_data._M_start + 1) = 0.0;
  *(deUint32 *)
   ((long)(renderPassClearValues.
           super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
           super__Vector_impl_data._M_start + 1) + 4) = 0;
  *(undefined8 *)
   ((long)renderPassClearValues.
          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 0x18) = 0;
  *(float *)(renderPassClearValues.
             super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
             super__Vector_impl_data._M_start + 1) = 0.0;
  *(deUint32 *)
   ((long)(renderPassClearValues.
           super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
           super__Vector_impl_data._M_start + 1) + 4) = 0;
  *(undefined8 *)
   ((long)renderPassClearValues.
          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 0x18) = 0;
  *(float *)renderPassClearValues.
            super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
            super__Vector_impl_data._M_start = 0.0;
  *(deUint32 *)
   ((long)renderPassClearValues.
          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)renderPassClearValues.
          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
          super__Vector_impl_data._M_start + 8) = 0;
  renderPassClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       renderPassClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  Draw::RenderPassBeginInfo::RenderPassBeginInfo
            ((RenderPassBeginInfo *)&info,
             (VkRenderPass)
             (this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.m_renderPass.
             super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,
             (VkFramebuffer)
             (this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.m_framebuffer.
             super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal,
             (VkRect2D)(ZEXT816(0x4000000040) << 0x40),&renderPassClearValues);
  Draw::transition2DImage
            (vk,(VkCommandBuffer)
                local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,
             (VkImage)(((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                        m_colorAttachmentImage.m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1,
             VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,0,0x100);
  Draw::transition2DImage
            (vk,(VkCommandBuffer)
                local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,
             (VkImage)(((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                        m_depthImage.m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>
                      .m_data.object.m_internal,2,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,0,0x400);
  (*vk->_vptr_DeviceInterface[0x70])
            (vk,local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,
             obj.m_internal,0,1);
  (*vk->_vptr_DeviceInterface[0x74])
            (vk,local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,
             &info,1);
  (*vk->_vptr_DeviceInterface[0x77])
            (vk,local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,1,
             &local_138);
  (*vk->_vptr_DeviceInterface[0x76])
            (vk,local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal);
  Draw::transition2DImage
            (vk,(VkCommandBuffer)
                local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,
             (VkImage)(((this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
                        m_colorAttachmentImage.m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_GENERAL,0,0x100);
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (renderPassClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(renderPassClearValues.
                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)renderPassClearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)renderPassClearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (*vk->_vptr_DeviceInterface[0x4a])
            (vk,local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal);
  submitCommandsAndWait
            (vk,device,queue,
             (VkCommandBuffer)
             local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal);
  (*(this->super_VertexShaderTestInstance).super_GraphicBasicTestInstance.
    super_StatisticQueryTestInstance.super_TestInstance._vptr_TestInstance[6])
            (__return_storage_ptr__,this,obj.m_internal);
  if (local_138 != 0) {
    info._0_8_ = local_138;
    (*(code *)(pIStack_130->m_allocation).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr[0x12]
              ._vptr_Allocation)(pIStack_130,local_128,pIStack_120,1);
  }
  if ((VkCommandBuffer)
      local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal !=
      (VkCommandBuffer)0x0) {
    info._0_8_ = local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal;
    (*(local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface
               ,local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device,
               local_168.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator,1
              );
  }
  if (vertexBufferSp.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(vertexBufferSp.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      vertexBufferSp.m_ptr = (Buffer *)0x0;
      (*(vertexBufferSp.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(vertexBufferSp.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (vertexBufferSp.m_state != (SharedPtrStateBase *)0x0) {
        (*(vertexBufferSp.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      vertexBufferSp.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)11>_>::operator()
              (&DStack_f0,(VkQueryPool)obj.m_internal);
  }
  if (cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus VertexShaderSecondaryTestInstance::executeTest (void)
{
	const DeviceInterface&					vk						= m_context.getDeviceInterface();
	const VkDevice							device					= m_context.getDevice();
	const VkQueue							queue					= m_context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();

	const CmdPoolCreateInfo					cmdPoolCreateInfo		(queueFamilyIndex);
	const Move<VkCommandPool>				cmdPool					= createCommandPool(vk, device, &cmdPoolCreateInfo);
	const Unique<VkQueryPool>				queryPool				(makeQueryPool(vk, device, m_parametersGraphic.queryStatisticFlags));

	const VkDeviceSize						vertexBufferOffset		= 0u;
	const de::SharedPtr<Buffer>				vertexBufferSp			= creatAndFillVertexBuffer();
	const VkBuffer							vertexBuffer			= vertexBufferSp->object();

	const Unique<VkCommandBuffer>			primaryCmdBuffer		(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const Unique<VkCommandBuffer>			secondaryCmdBuffer		(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_SECONDARY));

	beginSecondaryCommandBuffer(vk, *secondaryCmdBuffer, m_parametersGraphic.queryStatisticFlags, *m_renderPass, *m_framebuffer, VK_COMMAND_BUFFER_USAGE_RENDER_PASS_CONTINUE_BIT);
		vk.cmdBindPipeline(*secondaryCmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
		vk.cmdBeginQuery(*secondaryCmdBuffer, *queryPool, 0u, (VkQueryControlFlags)0u);
		vk.cmdBindVertexBuffers(*secondaryCmdBuffer, 0u, 1u, &vertexBuffer, &vertexBufferOffset);
		draw(*secondaryCmdBuffer);
		vk.cmdEndQuery(*secondaryCmdBuffer, *queryPool, 0u);
	vk.endCommandBuffer(*secondaryCmdBuffer);

	beginCommandBuffer(vk, *primaryCmdBuffer);
	{
		const VkRect2D				renderArea				= { { 0, 0 }, { WIDTH, HEIGHT } };
		std::vector<VkClearValue>	renderPassClearValues	(2);
		deMemset(&renderPassClearValues[0], 0, static_cast<int>(renderPassClearValues.size()) * sizeof(VkClearValue));
		const RenderPassBeginInfo	renderPassBegin			(*m_renderPass, *m_framebuffer, renderArea, renderPassClearValues);

		transition2DImage(vk, *primaryCmdBuffer, m_colorAttachmentImage->object(), VK_IMAGE_ASPECT_COLOR_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, 0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
		transition2DImage(vk, *primaryCmdBuffer, m_depthImage->object(), VK_IMAGE_ASPECT_DEPTH_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL, 0, VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT);

		vk.cmdResetQueryPool(*primaryCmdBuffer, *queryPool, 0u, 1u);

		vk.cmdBeginRenderPass(*primaryCmdBuffer, &renderPassBegin, VK_SUBPASS_CONTENTS_SECONDARY_COMMAND_BUFFERS);
		vk.cmdExecuteCommands(*primaryCmdBuffer, 1u, &secondaryCmdBuffer.get());
		vk.cmdEndRenderPass(*primaryCmdBuffer);
		transition2DImage(vk, *primaryCmdBuffer, m_colorAttachmentImage->object(), VK_IMAGE_ASPECT_COLOR_BIT, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL, 0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
	}
	vk.endCommandBuffer(*primaryCmdBuffer);

	// Wait for completion
	submitCommandsAndWait(vk, device, queue, *primaryCmdBuffer);
	return checkResult (*queryPool);
}